

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O2

Statement *
slang::ast::ForLoopStatement::fromSyntax
          (Compilation *compilation,ForLoopStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  ExpressionKind EVar1;
  bitmask<slang::ast::StatementFlags> bVar2;
  size_t sVar3;
  Expression *this;
  bool bVar4;
  int iVar5;
  int iVar6;
  VariableSymbol *var;
  SyntaxNode *pSVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExpressionSyntax *pEVar8;
  Expression *this_00;
  Compilation *pCVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Compilation *loop;
  undefined4 extraout_var_05;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  undefined8 extraout_RDX;
  Compilation *ctx;
  ulong uVar10;
  byte bVar11;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_(std::ranges::subrange_kind)0>
  sVar12;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  guard;
  Expression *stopExpr;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_128;
  StatementContext *local_118;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_110;
  SmallVector<const_slang::ast::Expression_*,_5UL> steps;
  SmallVector<const_slang::ast::VariableSymbol_*,_5UL> loopVars;
  SmallVector<const_slang::ast::Expression_*,_5UL> initializers;
  SourceRange local_40;
  undefined4 extraout_var_01;
  
  initializers.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)initializers.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  initializers.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  initializers.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  loopVars.super_SmallVectorBase<const_slang::ast::VariableSymbol_*>.data_ =
       (pointer)loopVars.super_SmallVectorBase<const_slang::ast::VariableSymbol_*>.firstElement;
  loopVars.super_SmallVectorBase<const_slang::ast::VariableSymbol_*>.len = 0;
  loopVars.super_SmallVectorBase<const_slang::ast::VariableSymbol_*>.cap = 5;
  uVar10 = 0;
  local_118 = stmtCtx;
  if ((syntax->initializers).elements._M_extent._M_extent_value != 0) {
    pSVar7 = slang::syntax::TokenOrSyntax::node((syntax->initializers).elements._M_ptr);
    if (pSVar7->kind == ForVariableDeclaration) {
      sVar12 = Scope::membersOfType<slang::ast::VariableSymbol>((context->scope).ptr);
      steps.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
           (pointer)sVar12._M_begin.current;
      while ((Symbol *)steps.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ !=
             sVar12._M_end.current.current) {
        guard.func.this =
             (StatementContext *)steps.super_SmallVectorBase<const_slang::ast::Expression_*>.data_;
        SmallVectorBase<slang::ast::VariableSymbol_const*>::
        emplace_back<slang::ast::VariableSymbol_const*>
                  ((SmallVectorBase<slang::ast::VariableSymbol_const*> *)&loopVars,
                   (VariableSymbol **)&guard);
        Scope::specific_symbol_iterator<slang::ast::VariableSymbol>::increment
                  ((specific_symbol_iterator<slang::ast::VariableSymbol> *)&steps);
      }
      bVar11 = 0;
      goto LAB_003e4b56;
    }
    uVar10 = (syntax->initializers).elements._M_extent._M_extent_value + 1 >> 1;
  }
  bVar11 = 0;
  steps.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)&syntax->initializers
  ;
  for (steps.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
      ((SeparatedSyntaxList<slang::syntax::SyntaxNode> *)
       steps.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ != &syntax->initializers ||
      (steps.super_SmallVectorBase<const_slang::ast::Expression_*>.len != uVar10));
      steps.super_SmallVectorBase<const_slang::ast::Expression_*>.len =
           steps.super_SmallVectorBase<const_slang::ast::Expression_*>.len + 1) {
    pSVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::
             iterator_base<const_slang::syntax::SyntaxNode_*>::dereference
                       ((iterator_base<const_slang::syntax::SyntaxNode_*> *)&steps);
    iVar5 = Expression::bind((int)pSVar7,(sockaddr *)context,8);
    guard.func.this = (StatementContext *)CONCAT44(extraout_var,iVar5);
    SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
              ((SmallVectorBase<slang::ast::Expression_const*> *)&initializers,(Expression **)&guard
              );
    bVar4 = Expression::bad((Expression *)CONCAT44(extraout_var,iVar5));
    bVar11 = bVar11 | bVar4;
  }
LAB_003e4b56:
  stopExpr = (Expression *)0x0;
  if (syntax->stopExpr != (ExpressionSyntax *)0x0) {
    iVar5 = Expression::bind((int)syntax->stopExpr,(sockaddr *)context,0);
    stopExpr = (Expression *)CONCAT44(extraout_var_00,iVar5);
  }
  this = stopExpr;
  steps.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)steps.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  steps.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  steps.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  guard.func.savedFlags.m_bits = 0;
  guard.func._12_4_ = 0;
  sVar3 = (syntax->steps).elements._M_extent._M_extent_value;
  guard.func.this = (StatementContext *)&syntax->steps;
  do {
    if (((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)guard.func.this == &syntax->steps)
       && (guard.func._8_8_ == sVar3 + 1 >> 1)) {
      if ((bVar11 != 0) || ((this != (Expression *)0x0 && (bVar4 = Expression::bad(this), bVar4))))
      {
        ctx = (Compilation *)0x0;
        pCVar9 = (Compilation *)Statement::badStmt(compilation,(Statement *)0x0);
      }
      else {
        bVar2.m_bits = (local_118->flags).m_bits;
        guard.func.this = local_118;
        guard.func.savedFlags.m_bits = bVar2.m_bits;
        guard.valid = true;
        (local_118->flags).m_bits = bVar2.m_bits | 9;
        iVar5 = Statement::bind((int)(syntax->statement).ptr,(sockaddr *)context,
                                (socklen_t)local_118);
        iVar6 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                          (&initializers.super_SmallVectorBase<const_slang::ast::Expression_*>,
                           (EVP_PKEY_CTX *)compilation,src);
        local_128._M_ptr = (pointer)CONCAT44(extraout_var_03,iVar6);
        iVar6 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                          (&steps.super_SmallVectorBase<const_slang::ast::Expression_*>,
                           (EVP_PKEY_CTX *)compilation,src_00);
        local_110._M_ptr = (pointer)CONCAT44(extraout_var_04,iVar6);
        local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        loop = (Compilation *)
               BumpAllocator::
               emplace<slang::ast::ForLoopStatement,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
                         (&compilation->super_BumpAllocator,&local_128,&stopExpr,&local_110,
                          (Statement *)CONCAT44(extraout_var_02,iVar5),&local_40);
        ctx = compilation;
        iVar6 = SmallVectorBase<const_slang::ast::VariableSymbol_*>::copy
                          (&loopVars.super_SmallVectorBase<const_slang::ast::VariableSymbol_*>,
                           (EVP_PKEY_CTX *)compilation,src_01);
        (loop->options).maxInstanceArray = iVar6;
        (loop->options).maxRecursiveClassSpecialization = extraout_var_05;
        (loop->options).maxUDPCoverageNotes = (int)extraout_RDX;
        (loop->options).errorLimit = (int)((ulong)extraout_RDX >> 0x20);
        if (((Statement *)CONCAT44(extraout_var_02,iVar5))->kind == Invalid) {
          pCVar9 = (Compilation *)Statement::badStmt(compilation,(Statement *)loop);
          ctx = loop;
        }
        else {
          pCVar9 = loop;
          if ((((bVar2.m_bits & 8) == 0) && (((compilation->options).flags.m_bits & 0x20) == 0)) &&
             (bVar4 = Scope::isUninstantiated((context->scope).ptr), !bVar4)) {
            ctx = loop;
            UnrollVisitor::run(context,(ForLoopStatement *)loop);
          }
        }
        ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/Statement.h:162:37)>
        ::~ScopeGuard(&guard);
      }
      SmallVectorBase<const_slang::ast::Expression_*>::cleanup
                (&steps.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)ctx);
      SmallVectorBase<const_slang::ast::VariableSymbol_*>::cleanup
                (&loopVars.super_SmallVectorBase<const_slang::ast::VariableSymbol_*>,
                 (EVP_PKEY_CTX *)ctx);
      SmallVectorBase<const_slang::ast::Expression_*>::cleanup
                (&initializers.super_SmallVectorBase<const_slang::ast::Expression_*>,
                 (EVP_PKEY_CTX *)ctx);
      return (Statement *)pCVar9;
    }
    pEVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<const_slang::syntax::ExpressionSyntax_*>::dereference
                       ((iterator_base<const_slang::syntax::ExpressionSyntax_*> *)&guard);
    iVar5 = Expression::bind((int)pEVar8,(sockaddr *)context,8);
    this_00 = (Expression *)CONCAT44(extraout_var_01,iVar5);
    local_128._M_ptr = (pointer)this_00;
    SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
              ((SmallVectorBase<slang::ast::Expression_const*> *)&steps,(Expression **)&local_128);
    bVar4 = Expression::bad(this_00);
    bVar11 = bVar11 | bVar4;
    EVar1 = this_00->kind;
    if (EVar1 != Invalid) {
      if (EVar1 == UnaryOp) {
        if (3 < this_00[1].kind - UnaryOp) goto LAB_003e4c3f;
      }
      else if ((EVar1 != Assignment) && (EVar1 != Call)) {
LAB_003e4c3f:
        bVar11 = 1;
        ASTContext::addDiag(context,(DiagCode)0x250008,this_00->sourceRange);
      }
    }
    guard.func._8_8_ = guard.func._8_8_ + 1;
  } while( true );
}

Assistant:

Statement& ForLoopStatement::fromSyntax(Compilation& compilation,
                                        const ForLoopStatementSyntax& syntax,
                                        const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> initializers;
    SmallVector<const VariableSymbol*> loopVars;
    bool anyBad = false;

    const bool hasVarDecls = !syntax.initializers.empty() &&
                             syntax.initializers[0]->kind == SyntaxKind::ForVariableDeclaration;
    if (hasVarDecls) {
        // The block should have already been created for us containing the
        // variable declarations.
        for (auto& var : context.scope->membersOfType<VariableSymbol>())
            loopVars.push_back(&var);
    }
    else {
        for (auto initializer : syntax.initializers) {
            auto& init = Expression::bind(initializer->as<ExpressionSyntax>(), context,
                                          ASTFlags::AssignmentAllowed);
            initializers.push_back(&init);
            anyBad |= init.bad();
        }
    }

    const Expression* stopExpr = nullptr;
    if (syntax.stopExpr)
        stopExpr = &Expression::bind(*syntax.stopExpr, context);

    SmallVector<const Expression*> steps;
    for (auto step : syntax.steps) {
        auto& expr = Expression::bind(*step, context, ASTFlags::AssignmentAllowed);
        steps.push_back(&expr);
        anyBad |= expr.bad();

        bool stepOk;
        switch (expr.kind) {
            case ExpressionKind::Invalid:
            case ExpressionKind::Assignment:
            case ExpressionKind::Call:
                stepOk = true;
                break;
            case ExpressionKind::UnaryOp: {
                auto op = expr.as<UnaryExpression>().op;
                stepOk = op == UnaryOperator::Preincrement || op == UnaryOperator::Postincrement ||
                         op == UnaryOperator::Predecrement || op == UnaryOperator::Postdecrement;
                break;
            }
            default:
                stepOk = false;
                break;
        }

        if (!stepOk) {
            anyBad = true;
            context.addDiag(diag::InvalidForStepExpression, expr.sourceRange);
        }
    }

    if (anyBad || (stopExpr && stopExpr->bad()))
        return badStmt(compilation, nullptr);

    // For purposes of checking for multiple drivers to variables, we want to
    // "unroll" this for loop if possible to allow finer grained checking of
    // longest static prefixes involving the loop variables(s).
    const bool wasFirst = !stmtCtx.flags.has(StatementFlags::InForLoop);
    auto guard = stmtCtx.enterLoop(true);
    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);

    auto result = compilation.emplace<ForLoopStatement>(initializers.copy(compilation), stopExpr,
                                                        steps.copy(compilation), bodyStmt,
                                                        syntax.sourceRange());
    result->loopVars = loopVars.copy(compilation);

    if (bodyStmt.bad())
        return badStmt(compilation, result);

    // If this is the top-level unrollable for loop, attempt the unrolling now.
    // If not top-level, just pop up the stack and let the parent loop handle us.
    if (wasFirst && !compilation.hasFlag(CompilationFlags::StrictDriverChecking) &&
        !context.scope->isUninstantiated()) {
        UnrollVisitor::run(context, *result);
    }

    return *result;
}